

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpAcceptor::handle_accept
          (TcpAcceptor *this,pointer *ptr,pointer *new_connection,error_code *error)

{
  bool bVar1;
  AcceptingStates AVar2;
  element_type *peVar3;
  element_type *peVar4;
  shared_ptr<gmlc::networking::TcpAcceptor> *psVar5;
  error_code *__args_1;
  int iVar6;
  TcpAcceptor *in_RCX;
  int __type;
  int __type_00;
  int __type_01;
  int __fd;
  long in_RDI;
  error_code ec;
  shared_ptr<gmlc::networking::TcpAcceptor> *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  TriggerVariable *in_stack_fffffffffffffe78;
  int logLevel;
  shared_ptr<gmlc::networking::TcpConnection> *in_stack_fffffffffffffe80;
  error_code *in_stack_fffffffffffffe88;
  TriggerVariable *in_stack_fffffffffffffe90;
  function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined1 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined1 local_128 [120];
  shared_ptr<gmlc::networking::TcpAcceptor> local_b0;
  undefined1 local_a0 [16];
  undefined1 local_90 [48];
  int local_60;
  undefined8 local_20;
  
  local_20 = in_RCX;
  AVar2 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::load
                    ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)(in_RDI + 0xe8),
                     seq_cst);
  iVar6 = (int)in_RCX;
  if (AVar2 == CONNECTED) {
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_20);
    if (bVar1) {
      std::error_code::error_code<asio::error::basic_errors,void>
                ((error_code *)in_stack_fffffffffffffe90,
                 (basic_errors)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      __fd = (int)local_a0;
      bVar1 = std::operator==((error_code *)local_20,(error_code *)in_stack_fffffffffffffe78);
      logLevel = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x713208);
        TcpConnection::close(peVar3,__fd);
        concurrency::TriggerVariable::reset(in_stack_fffffffffffffe90);
      }
      else {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>
                            *)0x712f92);
        if (bVar1) {
          __args_1 = (error_code *)(in_RDI + 0xa8);
          psVar5 = &local_b0;
          std::shared_ptr<gmlc::networking::TcpAcceptor>::shared_ptr
                    ((shared_ptr<gmlc::networking::TcpAcceptor> *)__args_1,in_stack_fffffffffffffe68
                    );
          std::
          function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>::
          operator()((function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>
                      *)local_20,psVar5,__args_1);
          std::shared_ptr<gmlc::networking::TcpAcceptor>::~shared_ptr
                    ((shared_ptr<gmlc::networking::TcpAcceptor> *)0x712fe5);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
                     (allocator<char> *)in_stack_fffffffffffffea0);
          std::error_code::message_abi_cxx11_(in_stack_fffffffffffffe88);
          std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
          logger((TcpAcceptor *)local_20,logLevel,in_stack_fffffffffffffe70);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe70);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe70);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe70);
          std::allocator<char>::~allocator((allocator<char> *)(local_128 + 0x37));
        }
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x713159);
        TcpConnection::socket((TcpConnection *)local_128,(int)peVar3,__type_01,iVar6);
        peVar4 = std::
                 __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x713172);
        iVar6 = 1;
        (*peVar4->_vptr_Socket[0xe])(peVar4,1,0);
        std::shared_ptr<gmlc::networking::Socket>::~shared_ptr
                  ((shared_ptr<gmlc::networking::Socket> *)0x713191);
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x7131e3);
        TcpConnection::close(peVar3,iVar6);
        concurrency::TriggerVariable::reset(in_stack_fffffffffffffe90);
      }
    }
    else {
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                          *)in_stack_fffffffffffffe70);
      if (bVar1) {
        concurrency::TriggerVariable::reset(in_stack_fffffffffffffe90);
        psVar5 = (shared_ptr<gmlc::networking::TcpAcceptor> *)(in_RDI + 0x88);
        this_00 = (function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
                   *)(local_90 + 0x20);
        std::shared_ptr<gmlc::networking::TcpAcceptor>::shared_ptr
                  ((shared_ptr<gmlc::networking::TcpAcceptor> *)in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe68);
        std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
                  ((shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffe70,
                   (shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffe68);
        std::
        function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
        ::operator()(this_00,psVar5,in_stack_fffffffffffffe80);
        std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                  ((shared_ptr<gmlc::networking::TcpConnection> *)0x712e1a);
        std::shared_ptr<gmlc::networking::TcpAcceptor>::~shared_ptr
                  ((shared_ptr<gmlc::networking::TcpAcceptor> *)0x712e27);
        bVar1 = concurrency::TriggerVariable::isActive((TriggerVariable *)0x712e38);
        if (!bVar1) {
          concurrency::TriggerVariable::trigger(in_stack_fffffffffffffe78);
        }
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x712e91);
        TcpConnection::socket((TcpConnection *)local_90,(int)peVar3,__type_00,iVar6);
        peVar4 = std::
                 __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x712eb0);
        iVar6 = 1;
        (*peVar4->_vptr_Socket[0xe])(peVar4,1,0);
        std::shared_ptr<gmlc::networking::Socket>::~shared_ptr
                  ((shared_ptr<gmlc::networking::Socket> *)0x712ed2);
        peVar3 = std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x712f27);
        TcpConnection::close(peVar3,iVar6);
        concurrency::TriggerVariable::reset(in_stack_fffffffffffffe90);
      }
    }
  }
  else {
    puVar7 = &stack0xffffffffffffffd0;
    CLI::std::error_code::error_code((error_code *)in_stack_fffffffffffffe70);
    peVar3 = std::
             __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x712cc4);
    TcpConnection::socket((TcpConnection *)&stack0xffffffffffffffc0,(int)peVar3,__type,iVar6);
    peVar4 = std::
             __shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x712ce3);
    iVar6 = 1;
    local_60 = (*peVar4->_vptr_Socket[0xf])(peVar4,1,0,puVar7);
    std::shared_ptr<gmlc::networking::Socket>::~shared_ptr
              ((shared_ptr<gmlc::networking::Socket> *)0x712d2b);
    peVar3 = std::
             __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x712d35);
    TcpConnection::close(peVar3,iVar6);
    concurrency::TriggerVariable::reset(in_stack_fffffffffffffe90);
  }
  return;
}

Assistant:

void TcpAcceptor::handle_accept(
    TcpAcceptor::pointer ptr,
    TcpConnection::pointer new_connection,
    const std::error_code& error)
{
    if (state.load() != AcceptingStates::CONNECTED) {
        std::error_code ec;
        new_connection->socket()->set_option_linger(true, 0, ec);
        new_connection->close();
        accepting.reset();
        return;
    }
    if (!error) {
        if (acceptCall) {
            accepting.reset();
            acceptCall(std::move(ptr), std::move(new_connection));
            if (!accepting.isActive()) {
                accepting.trigger();
            }
        } else {
            try {
                new_connection->socket()->set_option_linger(true, 0);
            }
            catch (...) {
            }
            new_connection->close();
            accepting.reset();
        }
    } else if (error != asio::error::operation_aborted) {
        if (errorCall) {
            errorCall(std::move(ptr), error);
        } else {
            logger(0, std::string(" error in accept::") + error.message());
        }
        try {
            new_connection->socket()->set_option_linger(true, 0);
        }
        catch (...) {
        }
        new_connection->close();
        accepting.reset();
    } else {
        new_connection->close();
        accepting.reset();
    }
}